

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint_Scene::ByteSizeLong
          (VisionFeaturePrint_Scene *this)

{
  size_t sVar1;
  
  if (this->version_ == 0) {
    sVar1 = 0;
  }
  else {
    sVar1 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->version_);
    sVar1 = sVar1 + 1;
  }
  this->_cached_size_ = (int)sVar1;
  return sVar1;
}

Assistant:

size_t VisionFeaturePrint_Scene::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.CoreMLModels.VisionFeaturePrint.Scene)
  size_t total_size = 0;

  // .CoreML.Specification.CoreMLModels.VisionFeaturePrint.Scene.SceneVersion version = 1;
  if (this->version() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->version());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}